

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void printGameReport(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *maps,vector<char,_std::allocator<char>_> *players,int games,int draw,
                    vector<int,_std::allocator<int>_> *winners)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  __type _Var4;
  size_type sVar5;
  reference pvVar6;
  ostream *poVar7;
  reference pvVar8;
  void *pvVar9;
  reference pvVar10;
  int local_21c;
  undefined1 local_218 [4];
  int g;
  int local_1f4;
  undefined1 local_1f0 [4];
  int winnerIndex;
  string thisWinner;
  string local_1b0;
  string local_190;
  undefined1 local_170 [8];
  string to_print;
  string local_148;
  string local_128;
  int local_108;
  int local_104;
  int j;
  int i_2;
  int numberGames;
  int winnerIndexCounter;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string currPlayer;
  int i_1;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  playerStrats;
  int i;
  vector<int,_std::allocator<int>_> *winners_local;
  int draw_local;
  int games_local;
  vector<char,_std::allocator<char>_> *players_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *maps_local;
  
  std::operator<<((ostream *)&std::cout,
                  "\n\n--------------------------------------------------------\n");
  std::operator<<((ostream *)&std::cout,"--------------------Game Statistics---------------------\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "--------------------------------------------------------\n\n");
  std::operator<<((ostream *)&std::cout,"M: ");
  for (playerStrats.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      iVar1 = playerStrats.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(maps),
      iVar3 = playerStrats.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_, iVar1 < (int)sVar5;
      playerStrats.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           playerStrats.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(maps);
    if (iVar3 == (int)sVar5 + -1) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(maps,(long)playerStrats.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)pvVar6);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(maps,(long)playerStrats.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)pvVar6);
      std::operator<<(poVar7,", ");
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  std::operator<<((ostream *)&std::cout,"P: ");
  for (currPlayer.field_2._8_4_ = 0; uVar2 = currPlayer.field_2._8_4_,
      sVar5 = std::vector<char,_std::allocator<char>_>::size(players), (int)uVar2 < (int)sVar5;
      currPlayer.field_2._8_4_ = currPlayer.field_2._8_4_ + 1) {
    pvVar8 = std::vector<char,_std::allocator<char>_>::at
                       (players,(long)(int)currPlayer.field_2._8_4_);
    std::__cxx11::to_string((string *)local_78,(int)*pvVar8);
    std::__cxx11::to_string(&local_98,0x61);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if (_Var4) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,
                 (char (*) [10])"Aggresive");
    }
    else {
      std::__cxx11::to_string(&local_b8,0x62);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (_Var4) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[8]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,
                   (char (*) [8])"Passive");
      }
      else {
        std::__cxx11::to_string(&local_d8,99);
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_78,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        if (_Var4) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[7]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,
                     (char (*) [7])"Random");
        }
        else {
          std::__cxx11::to_string((string *)&numberGames,100);
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_78,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&numberGames);
          std::__cxx11::string::~string((string *)&numberGames);
          if (_Var4) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[8]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48
                       ,(char (*) [8])"Cheater");
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[8]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48
                       ,(char (*) [8])"Unknown");
          }
        }
      }
    }
    uVar2 = currPlayer.field_2._8_4_;
    sVar5 = std::vector<char,_std::allocator<char>_>::size(players);
    if (uVar2 == (int)sVar5 + -1) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_48,(long)(int)currPlayer.field_2._8_4_);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)pvVar6);
      poVar7 = std::operator<<(poVar7,".");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_48,(long)(int)currPlayer.field_2._8_4_);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)pvVar6);
      std::operator<<(poVar7,", ");
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"G: ");
  pvVar9 = (void *)std::ostream::operator<<(poVar7,games);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"D: ");
  pvVar9 = (void *)std::ostream::operator<<(poVar7,draw);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  i_2 = 0;
  j = 0;
  for (local_104 = 0; iVar1 = local_104,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(maps), iVar1 < (int)sVar5 + 1; local_104 = local_104 + 1) {
    for (local_108 = 0; local_108 <= games; local_108 = local_108 + 1) {
      if ((local_108 == 0) && (local_104 == 0)) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n\n");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148," ",(allocator<char> *)(to_print.field_2._M_local_buf + 0xf)
                  );
        centerOut(&local_128,&local_148,0x14);
        poVar7 = std::operator<<(poVar7,(string *)&local_128);
        std::operator<<(poVar7," | ");
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator((allocator<char> *)(to_print.field_2._M_local_buf + 0xf));
      }
      else if (local_104 == 0) {
        std::__cxx11::to_string(&local_190,local_108);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,"Game ",&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        centerOut(&local_1b0,(string *)local_170,10);
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_1b0);
        std::operator<<(poVar7," | ");
        std::__cxx11::string::~string((string *)&local_1b0);
        j = j + 1;
        std::__cxx11::string::~string((string *)local_170);
      }
      else if (local_108 == 0) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(maps,(long)(local_104 + -1));
        centerOut((string *)((long)&thisWinner.field_2 + 8),pvVar6,0x14);
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 (string *)(thisWinner.field_2._M_local_buf + 8));
        std::operator<<(poVar7," | ");
        std::__cxx11::string::~string((string *)(thisWinner.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::string((string *)local_1f0);
        pvVar10 = std::vector<int,_std::allocator<int>_>::at(winners,(long)i_2);
        local_1f4 = *pvVar10;
        i_2 = i_2 + 1;
        if (local_1f4 == -1) {
          std::__cxx11::string::operator=((string *)local_1f0,"Draw");
        }
        else {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_48,(long)local_1f4);
          std::__cxx11::string::operator=((string *)local_1f0,(string *)pvVar6);
        }
        centerOut((string *)local_218,(string *)local_1f0,10);
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_218);
        std::operator<<(poVar7," | ");
        std::__cxx11::string::~string((string *)local_218);
        std::__cxx11::string::~string((string *)local_1f0);
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    for (local_21c = 0; local_21c < j * 0xd + 0x16; local_21c = local_21c + 1) {
      std::operator<<((ostream *)&std::cout,"-");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return;
}

Assistant:

static void printGameReport(vector<std::string> maps, vector<char> players, int games, int draw, vector<int> winners) {
    std::cout << "\n\n--------------------------------------------------------\n";
    std::cout << "--------------------Game Statistics---------------------\n";
    std::cout << "--------------------------------------------------------\n\n";

    //print maps
    std::cout << "M: ";
    for (int i = 0; i < int(maps.size()); i++) {
        if (i == int(maps.size() - 1)) {
            std::cout << maps.at(i) << std::endl;
        } else {
            std::cout << maps.at(i) << ", ";
        }
    }

    //normalize and print players
    vector<std::string> playerStrats;
    std::cout << "P: ";
    for (int i = 0; i < int(players.size()); i++) {
        std::string currPlayer = std::to_string(players.at(i));
        //normalize
        if (currPlayer == std::to_string('a')) {
            playerStrats.emplace_back("Aggresive");
        } else if (currPlayer == std::to_string('b')) {
            playerStrats.emplace_back("Passive");
        } else if (currPlayer == std::to_string('c')) {
            playerStrats.emplace_back("Random");
        } else if (currPlayer == std::to_string('d')) {
            playerStrats.emplace_back("Cheater");
        } else {
            playerStrats.emplace_back("Unknown");
        }
        //print
        if (i == int(players.size() - 1)) {
            std::cout << playerStrats.at(i) << "." << std::endl;
        } else {
            std::cout << playerStrats.at(i) << ", ";
        }
    }

    //print other info
    std::cout << "G: " << games << std::endl;
    std::cout << "D: " << draw << std::endl;

    //print table
    int winnerIndexCounter = 0;
    int numberGames = 0;
    for (int i = 0; i < int(maps.size() + 1); i++) {
        for (int j = 0; j <= games; j++) {
            if (j == 0 && i == 0) {
                std::cout << "\n\n" << centerOut(" ", 20) << " | ";
            } else if (i == 0) {
                std::string to_print = "Game " + std::to_string(j);
                std::cout << centerOut(to_print, 10) << " | ";
                numberGames++;
            } else if (j == 0) {
                std::cout << centerOut(maps.at(i - 1), 20) << " | ";
            } else {
                std::string thisWinner;
                int winnerIndex = winners.at(winnerIndexCounter);
                winnerIndexCounter++;
                if (winnerIndex == -1) {
                    thisWinner = "Draw";
                } else {
                    thisWinner = playerStrats.at(winnerIndex);
                }
                std::cout << centerOut(thisWinner, 10) << " | ";
            }
        }
        std::cout << std::endl;
        for (int g = 0; g < (13 * numberGames + 22); g++) {
            std::cout << "-";
        }
        std::cout << std::endl;
    }
}